

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperCoDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  int *piVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  DataKey DVar7;
  long lVar8;
  long lVar9;
  undefined4 *puVar10;
  pointer pnVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  steeppr *psVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  byte bVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_4d4;
  undefined1 local_4c8 [32];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [13];
  undefined3 uStack_45b;
  int iStack_458;
  bool bStack_454;
  undefined8 local_450;
  pointer local_440;
  DIdxSet *local_438;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  steeppr local_230 [112];
  int local_1c0;
  byte local_1bc;
  fpclass_type local_1b8;
  int32_t iStack_1b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  steeppr local_b0 [112];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar18 = 0;
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar1->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_440 = (pSVar1->weights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_3b0,-1,(type *)0x0);
  local_450._0_4_ = cpp_dec_float_finite;
  local_450._4_4_ = 0x1c;
  local_4c8._0_16_ = (undefined1  [16])0x0;
  local_4c8._16_16_ = (undefined1  [16])0x0;
  local_4a8 = (undefined1  [16])0x0;
  local_498 = (undefined1  [16])0x0;
  local_488 = (undefined1  [16])0x0;
  local_478 = (undefined1  [16])0x0;
  local_468 = SUB1613((undefined1  [16])0x0,0);
  uStack_45b = 0;
  iStack_458 = 0;
  bStack_454 = false;
  lVar9 = (long)(this->bestPricesCo).super_IdxSet.num;
  if (lVar9 < 1) {
    local_4d4 = -1;
  }
  else {
    lVar9 = lVar9 + 1;
    local_4d4 = -1;
    do {
      iVar6 = (this->bestPricesCo).super_IdxSet.idx[lVar9 + -2];
      pnVar11 = pnVar2 + iVar6;
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar13->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar18 * -8 + 4);
      }
      iStack_458 = pnVar2[iVar6].m_backend.exp;
      bStack_454 = pnVar2[iVar6].m_backend.neg;
      local_450._0_4_ = pnVar2[iVar6].m_backend.fpclass;
      local_450._4_4_ = pnVar2[iVar6].m_backend.prec_elem;
      pnVar12 = tol;
      pcVar13 = &local_430;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar13->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_430.exp = (tol->m_backend).exp;
      local_430.neg = (tol->m_backend).neg;
      local_430.fpclass = (tol->m_backend).fpclass;
      local_430.prec_elem = (tol->m_backend).prec_elem;
      if (local_430.data._M_elems[0] != 0 || local_430.fpclass != cpp_dec_float_finite) {
        local_430.neg = (bool)(local_430.neg ^ 1);
      }
      if (local_430.fpclass == cpp_dec_float_NaN || (fpclass_type)local_450 == cpp_dec_float_NaN) {
LAB_005b5646:
        piVar3 = (this->bestPricesCo).super_IdxSet.idx;
        iVar5 = (this->bestPricesCo).super_IdxSet.num;
        (this->bestPricesCo).super_IdxSet.num = iVar5 + -1;
        piVar3[lVar9 + -2] = piVar3[(long)iVar5 + -1];
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasibleCo).data[iVar6] = 0;
      }
      else {
        iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_4c8,&local_430);
        if (-1 < iVar5) goto LAB_005b5646;
        puVar10 = (undefined4 *)local_4c8;
        psVar15 = local_b0;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          *(undefined4 *)psVar15 = *puVar10;
          puVar10 = puVar10 + (ulong)bVar18 * -2 + 1;
          psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
        }
        local_40 = iStack_458;
        local_3c = bStack_454;
        local_38 = (fpclass_type)local_450;
        iStack_34 = local_450._4_4_;
        pnVar11 = local_440 + iVar6;
        pnVar12 = &local_130;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = local_440[iVar6].m_backend.exp;
        local_130.m_backend.neg = local_440[iVar6].m_backend.neg;
        local_130.m_backend.fpclass = local_440[iVar6].m_backend.fpclass;
        local_130.m_backend.prec_elem = local_440[iVar6].m_backend.prec_elem;
        pnVar12 = tol;
        pnVar16 = &local_1b0;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (tol->m_backend).exp;
        local_1b0.m_backend.neg = (tol->m_backend).neg;
        local_1b0.m_backend.fpclass = (tol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (tol->m_backend).prec_elem;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_430,local_b0,&local_130,&local_1b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_b0);
        pcVar13 = &local_430;
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pcVar17->data)._M_elems[0] =
               (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar18 * -2 + 1) * 4)
          ;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar18 * -8 + 4);
        }
        iStack_458 = local_430.exp;
        bStack_454 = local_430.neg;
        local_450._0_4_ = local_430.fpclass;
        local_450._4_4_ = local_430.prec_elem;
        if ((local_430.fpclass != cpp_dec_float_NaN) &&
           ((best->m_backend).fpclass != cpp_dec_float_NaN)) {
          iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_4c8,&best->m_backend);
          if (0 < iVar5) {
            puVar14 = (uint *)local_4c8;
            pnVar12 = best;
            for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
              (pnVar12->m_backend).data._M_elems[0] = *puVar14;
              puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
              pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
            }
            (best->m_backend).exp = iStack_458;
            (best->m_backend).neg = bStack_454;
            (best->m_backend).fpclass = (fpclass_type)local_450;
            (best->m_backend).prec_elem = local_450._4_4_;
            local_4d4 = iVar6;
          }
        }
        if ((((fpclass_type)local_450 == cpp_dec_float_NaN) ||
            (local_3b0.fpclass == cpp_dec_float_NaN)) ||
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_4c8,&local_3b0), -1 < iVar6))
        {
          if (local_3b0.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_430,0,(type *)0x0);
            iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3b0,&local_430);
            if (iVar6 < 0) goto LAB_005b5877;
          }
        }
        else {
LAB_005b5877:
          puVar14 = (uint *)local_4c8;
          pcVar13 = &local_3b0;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar13->data)._M_elems[0] = *puVar14;
            puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar18 * -2 + 1) * 4);
          }
          local_3b0.exp = iStack_458;
          local_3b0.neg = bStack_454;
          local_3b0.fpclass = (fpclass_type)local_450;
          local_3b0.prec_elem = local_450._4_4_;
        }
      }
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  lVar9 = (long)(((this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->updateViolsCo).super_IdxSet.num;
  if (0 < lVar9) {
    local_438 = &this->bestPricesCo;
    lVar9 = lVar9 + 1;
    do {
      pSVar1 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      iVar6 = (pSVar1->updateViolsCo).super_IdxSet.idx[lVar9 + -2];
      uVar4 = local_450;
      if ((pSVar1->isInfeasibleCo).data[iVar6] == 1) {
        pnVar11 = pnVar2 + iVar6;
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pcVar13->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar18 * -8 + 4);
        }
        iStack_458 = pnVar2[iVar6].m_backend.exp;
        bStack_454 = pnVar2[iVar6].m_backend.neg;
        local_450._0_4_ = pnVar2[iVar6].m_backend.fpclass;
        local_450._4_4_ = pnVar2[iVar6].m_backend.prec_elem;
        pnVar12 = tol;
        pcVar13 = &local_430;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pcVar13->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar18 * -8 + 4);
        }
        local_430.exp = (tol->m_backend).exp;
        local_430.neg = (tol->m_backend).neg;
        local_430.fpclass = (tol->m_backend).fpclass;
        local_430.prec_elem = (tol->m_backend).prec_elem;
        if (local_430.data._M_elems[0] != 0 || local_430.fpclass != cpp_dec_float_finite) {
          local_430.neg = (bool)(local_430.neg ^ 1);
        }
        if (local_430.fpclass != cpp_dec_float_NaN && (fpclass_type)local_450 != cpp_dec_float_NaN)
        {
          iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_4c8,&local_430);
          if (iVar5 < 0) {
            puVar10 = (undefined4 *)local_4c8;
            psVar15 = local_230;
            for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
              *(undefined4 *)psVar15 = *puVar10;
              puVar10 = puVar10 + (ulong)bVar18 * -2 + 1;
              psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
            }
            local_1c0 = iStack_458;
            local_1bc = bStack_454;
            local_1b8 = (fpclass_type)local_450;
            iStack_1b4 = local_450._4_4_;
            pnVar11 = local_440 + iVar6;
            pnVar12 = &local_2b0;
            for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
              (pnVar12->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
              pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
              pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
            }
            local_2b0.m_backend.exp = local_440[iVar6].m_backend.exp;
            local_2b0.m_backend.neg = local_440[iVar6].m_backend.neg;
            local_2b0.m_backend.fpclass = local_440[iVar6].m_backend.fpclass;
            local_2b0.m_backend.prec_elem = local_440[iVar6].m_backend.prec_elem;
            pnVar12 = tol;
            pnVar16 = &local_330;
            for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
              (pnVar16->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
              pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
              pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
            }
            local_330.m_backend.exp = (tol->m_backend).exp;
            local_330.m_backend.neg = (tol->m_backend).neg;
            local_330.m_backend.fpclass = (tol->m_backend).fpclass;
            local_330.m_backend.prec_elem = (tol->m_backend).prec_elem;
            steeppr::
            computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_430,local_230,&local_2b0,&local_330,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_230);
            pcVar13 = &local_430;
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
            for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar13 + ((ulong)bVar18 * -2 + 1) * 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar18 * -8 + 4);
            }
            iStack_458 = local_430.exp;
            bStack_454 = local_430.neg;
            uVar4._0_4_ = local_430.fpclass;
            uVar4._4_4_ = local_430.prec_elem;
            local_450._0_4_ = local_430.fpclass;
            local_450._4_4_ = local_430.prec_elem;
            if (((local_430.fpclass != cpp_dec_float_NaN) &&
                (local_3b0.fpclass != cpp_dec_float_NaN)) &&
               (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_4c8,&local_3b0),
               uVar4 = local_450, 0 < iVar5)) {
              if ((((fpclass_type)local_450 != cpp_dec_float_NaN) &&
                  ((best->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_4c8,&best->m_backend),
                 0 < iVar5)) {
                puVar14 = (uint *)local_4c8;
                pnVar12 = best;
                for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                  (pnVar12->m_backend).data._M_elems[0] = *puVar14;
                  puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
                  pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
                }
                (best->m_backend).exp = iStack_458;
                (best->m_backend).neg = bStack_454;
                (best->m_backend).fpclass = (fpclass_type)local_450;
                (best->m_backend).prec_elem = local_450._4_4_;
                local_4d4 = iVar6;
              }
              (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->isInfeasibleCo).data[iVar6] = 2;
              DIdxSet::addIdx(local_438,iVar6);
              uVar4 = local_450;
            }
            goto LAB_005b59e3;
          }
        }
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasibleCo).data[iVar6] = 0;
        uVar4 = local_450;
      }
LAB_005b59e3:
      local_450 = uVar4;
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  if (local_4d4 < 0) {
    DVar7.info = 0;
    DVar7.idx = -1;
  }
  else {
    DVar7 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::id((this->
                          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver,local_4d4);
  }
  return (SPxId)DVar7;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterHyperCoDim(R& best, R tol)
{
   const R* test        = this->thesolver->test().get_const_ptr();
   const R* weights_ptr = this->thesolver->weights.get_const_ptr();

   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPricesCo.size() - 1; i >= 0; --i)
   {
      idx = bestPricesCo.index(i);
      x = test[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, weights_ptr[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPricesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViolsCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViolsCo.index(i);

      // only look at indices that were not checked already
      if(this->thesolver->isInfeasibleCo[idx] == this->VIOLATED)
      {
         x = test[idx];

         if(x < -tol)
         {
            x = steeppr::computePrice(x, weights_ptr[idx], tol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
               }

               // put index into candidate list
               this->thesolver->isInfeasibleCo[idx] = this->VIOLATED_AND_CHECKED;
               bestPricesCo.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);
   else
      return SPxId();
}